

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

bool LTOnlineChannel::IsRevocationError(string *err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long lVar1;
  string *in_RDI;
  string s;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  initializer_list<const_char_*> *in_stack_ffffffffffffff70;
  allocator<char> local_71;
  string local_70 [16];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  initializer_list<const_char_*> local_28;
  initializer_list<const_char_*> *local_18;
  string *local_10;
  byte local_1;
  
  local_40 = "revocation";
  local_38 = "80092012";
  local_30 = "80092013";
  local_28._M_array = &local_40;
  local_28._M_len = 3;
  local_18 = &local_28;
  local_10 = in_RDI;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::initializer_list<const_char_*>::begin(local_18);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::initializer_list<const_char_*>::end(in_stack_ffffffffffffff70);
  for (; local_48 != this;
      local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_48->_M_string_length) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::allocator<char>::~allocator(&local_71);
    lVar1 = std::__cxx11::string::find(local_10,(ulong)local_70);
    if (lVar1 != -1) {
      local_1 = 1;
    }
    std::__cxx11::string::~string(local_70);
    if (lVar1 != -1) goto LAB_001c70e4;
  }
  local_1 = 0;
LAB_001c70e4:
  return (bool)(local_1 & 1);
}

Assistant:

bool LTOnlineChannel::IsRevocationError (const std::string& err)
{
    // we can check for the word "revocation", but in localized versions of
    // Windows this is translated! We have, so far, seen two different error codes.
    // So what we do is to look for all three things:
    for (const std::string s: ERR_CURL_REVOKE_MSG)
        if (err.find(s) != std::string::npos)
            return true;
    return false;
}